

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O0

int __thiscall
CVmObjDate::getp_getJulianDay(CVmObjDate *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  bignum_t<32> b;
  int iVar1;
  vm_obj_id_t obj;
  int *in_RCX;
  vm_val_t *in_RDX;
  CVmObjDate *in_RDI;
  bignum_t<32> jt;
  bignum_t<32> jday;
  caldate_t cd;
  uint argc;
  CVmNativeCodeDesc *in_stack_ffffffffffffff48;
  caldate_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  undefined4 uVar2;
  bignum_t<32> *in_stack_ffffffffffffff60;
  int local_94;
  long in_stack_ffffffffffffff78;
  undefined5 in_stack_ffffffffffffff80;
  undefined3 in_stack_ffffffffffffff85;
  undefined4 local_78;
  undefined1 local_74;
  
  if (in_RCX == (int *)0x0) {
    local_94 = 0;
  }
  else {
    local_94 = *in_RCX;
  }
  if ((getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_getJulianDay::desc,0);
    __cxa_guard_release(&getp_getJulianDay(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     (uint *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  if (iVar1 == 0) {
    get_ext(in_RDI);
    caldate_t::caldate_t
              (in_stack_ffffffffffffff50,(int32_t)((ulong)in_stack_ffffffffffffff48 >> 0x20));
    caldate_t::julian_dayno((caldate_t *)0x33f3aa);
    bignum_t<32>::bignum_t
              ((bignum_t<32> *)in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
    get_ext(in_RDI);
    bignum_t<32>::bignum_t
              ((bignum_t<32> *)in_stack_ffffffffffffff50,(long)in_stack_ffffffffffffff48);
    bignum_t<32>::operator/
              ((bignum_t<32> *)CONCAT35(in_stack_ffffffffffffff85,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    uVar2 = CONCAT31((int3)((uint)in_stack_ffffffffffffff5c >> 8),local_74);
    b.ext[8] = (char)in_stack_ffffffffffffff78;
    b.ext[9] = (char)((ulong)in_stack_ffffffffffffff78 >> 8);
    b.ext[10] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x10);
    b.ext[0xb] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x18);
    b.ext[0xc] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x20);
    b.ext[0xd] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x28);
    b.ext[0xe] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x30);
    b.ext[0xf] = (char)((ulong)in_stack_ffffffffffffff78 >> 0x38);
    b.ext._0_8_ = in_RDI;
    b.ext[0x10] = (char)in_stack_ffffffffffffff80;
    b.ext[0x11] = (char)((uint5)in_stack_ffffffffffffff80 >> 8);
    b.ext[0x12] = (char)((uint5)in_stack_ffffffffffffff80 >> 0x10);
    b.ext[0x13] = (char)((uint5)in_stack_ffffffffffffff80 >> 0x18);
    b.ext[0x14] = (char)((uint5)in_stack_ffffffffffffff80 >> 0x20);
    bignum_t<32>::operator+=(in_stack_ffffffffffffff60,b);
    obj = CVmObjBigNum::create<32>
                    ((int)((ulong)in_RDX >> 0x20),(bignum_t<32> *)CONCAT44(uVar2,local_78));
    vm_val_t::set_obj(in_RDX,obj);
    CVmStack::discard(local_94);
  }
  return 1;
}

Assistant:

int CVmObjDate::getp_getJulianDay(VMG_ vm_obj_id_t self,
                                  vm_val_t *retval, uint *oargc)
{
    /* check arguments */
    uint argc = (oargc != 0 ? *oargc : 0);
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* get the Julian day number for midnight UTC on my day number */
    caldate_t cd(get_ext()->dayno);
    bignum_t<32> jday(cd.julian_dayno());

    /* add my fraction of a day past midnight UTC */
    bignum_t<32> jt((long)get_ext()->daytime);
    jday += jt / (long)(24*60*60*1000);

    /* return a BigNumber result */
    retval->set_obj(CVmObjBigNum::create(vmg_ FALSE, &jday));

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}